

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O2

dtl_json_readerData_t * dtl_json_readerData_new(void)

{
  dtl_json_readerData_t *pdVar1;
  
  pdVar1 = (dtl_json_readerData_t *)malloc(0x30);
  if (pdVar1 != (dtl_json_readerData_t *)0x0) {
    pdVar1->currentElem = (dtl_dv_t *)0x0;
    pdVar1->parentElem = (dtl_dv_t *)0x0;
    pdVar1->isArray = false;
    pdVar1->isObject = false;
    adt_str_create(&pdVar1->objectKey);
  }
  return pdVar1;
}

Assistant:

static dtl_json_readerData_t* dtl_json_readerData_new(void)
{
   dtl_json_readerData_t *self = (dtl_json_readerData_t*) malloc(sizeof(dtl_json_readerData_t));
   if (self != 0)
   {
      dtl_json_readerData_create(self);
   }
   return self;
}